

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *pNtk,int fDuplicate)

{
  ulong uVar1;
  Abc_Obj_t *pDriver;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *__s1;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *__s;
  Vec_Ptr_t *pVVar6;
  char *pcVar7;
  char *__s2;
  Abc_Obj_t *pAVar8;
  int extraout_EDX;
  int Fill;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  long lVar9;
  int iVar10;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                  ,0x3de,"int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *, int)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar10 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar10 + 500;
    iVar5 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar5) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar5;
      in_RDX = extraout_RDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar10) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar5;
  }
  iVar10 = pNtk->nTravIds;
  pNtk->nTravIds = iVar10 + 1;
  if (0x3ffffffe < iVar10) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar6 = pNtk->vCos;
  if (pVVar6->nSize < 1) {
    iVar10 = 0;
  }
  else {
    lVar9 = 0;
    iVar10 = 0;
    do {
      iVar5 = (int)in_RDX;
      pAVar8 = (Abc_Obj_t *)pVVar6->pArray[lVar9];
      pDriver = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray];
      if ((pAVar8->field_0x15 & 4) == 0) {
        uVar3 = *(uint *)&pDriver->field_0x14 & 0xf;
        if ((uVar3 == 5) || (uVar3 == 2)) {
          pcVar7 = Abc_ObjName(pDriver);
          __s2 = Abc_ObjName(pAVar8);
          iVar4 = strcmp(pcVar7,__s2);
          iVar5 = extraout_EDX;
          if (iVar4 != 0) {
            Abc_NtkFixCoDriverProblem(pDriver,pAVar8,fDuplicate);
            in_RDX = extraout_RDX_01;
            goto LAB_00888e1a;
          }
        }
        pAVar2 = pDriver->pNtk;
        iVar4 = pDriver->Id;
        Vec_IntFillExtra(&pAVar2->vTravIds,iVar4 + 1,iVar5);
        if (((long)iVar4 < 0) || ((pAVar2->vTravIds).nSize <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pAVar2->vTravIds).pArray[iVar4] == pDriver->pNtk->nTravIds) {
          __s1 = pDriver->pNext;
          pcVar7 = Abc_ObjName(pAVar8);
          iVar5 = strcmp((char *)__s1,pcVar7);
          in_RDX = extraout_RDX_03;
          if (iVar5 != 0) {
            Abc_NtkFixCoDriverProblem(pDriver,pAVar8,fDuplicate);
            iVar10 = iVar10 + 1;
            in_RDX = extraout_RDX_04;
          }
        }
        else {
          pAVar8 = (Abc_Obj_t *)Abc_ObjName(pAVar8);
          pDriver->pNext = pAVar8;
          pAVar2 = pDriver->pNtk;
          iVar5 = pDriver->Id;
          iVar4 = pAVar2->nTravIds;
          Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,Fill);
          if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pAVar2->vTravIds).pArray[iVar5] = iVar4;
          in_RDX = extraout_RDX_05;
        }
      }
      else {
        Abc_NtkFixCoDriverProblem(pDriver,pAVar8,fDuplicate);
        in_RDX = extraout_RDX_02;
LAB_00888e1a:
        iVar10 = iVar10 + 1;
      }
      lVar9 = lVar9 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar9 < pVVar6->nSize);
  }
  iVar5 = Abc_NtkLogicHasSimpleCos(pNtk);
  if (iVar5 == 0) {
    __assert_fail("Abc_NtkLogicHasSimpleCos(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                  ,0x400,"int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *, int)");
  }
  return iVar10;
}

Assistant:

int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate )
{
    Abc_Obj_t * pNode, * pDriver;
    int i, nDupGates = 0;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        // if the driver is complemented, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjFaninC0(pNode) )
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
        // if the driver is a CI and has different name, this is an error
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
    }
    assert( Abc_NtkLogicHasSimpleCos(pNtk) );
    return nDupGates;
}